

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

string * __thiscall
calculator::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  char __c;
  bool bVar1;
  mapped_type *pmVar2;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  _Node_iterator_base<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_20;
  Token *local_18;
  Token *this_local;
  
  local_18 = this;
  this_local = (Token *)__return_storage_ptr__;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<calculator::Tag>,_std::equal_to<calculator::Tag>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->tagTable,&this->__tag);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<calculator::Tag>,_std::equal_to<calculator::Tag>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->tagTable);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    pmVar2 = std::
             unordered_map<calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<calculator::Tag>,_std::equal_to<calculator::Tag>,_std::allocator<std::pair<const_calculator::Tag,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->tagTable,&this->__tag);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  }
  else if (this->__tag == Other) {
    __c = this->__c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,1,__c,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_3d)
    ;
    std::allocator<char>::~allocator(local_3d);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() {
        if (tagTable.find(__tag) != tagTable.end())
            return tagTable[__tag];
        else if (__tag == Tag::Other) {
            return std::string(1, static_cast<char>(__c));
        } else
            return "";
    }